

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O2

sftp_request * sftp_alloc_request(void)

{
  uint uVar1;
  int *piVar2;
  void *pvVar3;
  sftp_request *e;
  uint index;
  uint uVar4;
  uint i;
  
  if (sftp_requests == (tree234 *)0x0) {
    sftp_requests = newtree234(sftp_reqcmp);
  }
  uVar1 = count234(sftp_requests);
  index = 0xffffffff;
  while (uVar4 = index, 1 < uVar1 - uVar4) {
    index = uVar4 + uVar1 >> 1;
    piVar2 = (int *)index234(sftp_requests,index);
    if (*piVar2 != index + 0x100) {
      uVar1 = index;
      index = uVar4;
    }
  }
  i = uVar4 + 0x101;
  pvVar3 = find234(sftp_requests,&i,sftp_reqfind);
  if (pvVar3 != (void *)0x0) {
    __assert_fail("NULL == find234(sftp_requests, &i, sftp_reqfind)",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/sftp.c",
                  0x88,"struct sftp_request *sftp_alloc_request(void)");
  }
  e = (sftp_request *)safemalloc(1,0x10,0);
  e->id = uVar4 + 0x101;
  e->registered = false;
  e->userdata = (void *)0x0;
  add234(sftp_requests,e);
  return e;
}

Assistant:

static struct sftp_request *sftp_alloc_request(void)
{
    unsigned low, high, mid;
    int tsize;
    struct sftp_request *r;

    if (sftp_requests == NULL)
        sftp_requests = newtree234(sftp_reqcmp);

    /*
     * First-fit allocation of request IDs: always pick the lowest
     * unused one. To do this, binary-search using the counted
     * B-tree to find the largest ID which is in a contiguous
     * sequence from the beginning. (Precisely everything in that
     * sequence must have ID equal to its tree index plus
     * REQUEST_ID_OFFSET.)
     */
    tsize = count234(sftp_requests);

    low = -1;
    high = tsize;
    while (high - low > 1) {
        mid = (high + low) / 2;
        r = index234(sftp_requests, mid);
        if (r->id == mid + REQUEST_ID_OFFSET)
            low = mid;                 /* this one is fine */
        else
            high = mid;                /* this one is past it */
    }
    /*
     * Now low points to either -1, or the tree index of the
     * largest ID in the initial sequence.
     */
    {
        unsigned i = low + 1 + REQUEST_ID_OFFSET;
        assert(NULL == find234(sftp_requests, &i, sftp_reqfind));
    }

    /*
     * So the request ID we need to create is
     * low + 1 + REQUEST_ID_OFFSET.
     */
    r = snew(struct sftp_request);
    r->id = low + 1 + REQUEST_ID_OFFSET;
    r->registered = false;
    r->userdata = NULL;
    add234(sftp_requests, r);
    return r;
}